

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::CheckDeclaredFunc(SharedValidator *this,Var *func_var)

{
  char *pcVar1;
  size_type sVar2;
  int in_EDX;
  int __c;
  key_type *__x;
  key_type local_24;
  Var *local_20;
  Var *func_var_local;
  SharedValidator *this_local;
  
  local_20 = func_var;
  func_var_local = (Var *)this;
  pcVar1 = Var::index(func_var,(char *)func_var,in_EDX);
  local_24 = (key_type)pcVar1;
  __x = &local_24;
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    (&this->declared_funcs_,__x);
  if (sVar2 == 0) {
    pcVar1 = Var::index(func_var,(char *)__x,__c);
    this_local._4_4_ =
         PrintError(this,&func_var->loc,"function %u is not declared in any elem sections",
                    (ulong)pcVar1 & 0xffffffff);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckDeclaredFunc(Var func_var) {
  if (declared_funcs_.count(func_var.index()) == 0) {
    return PrintError(func_var.loc,
                      "function %" PRIindex
                      " is not declared in any elem sections",
                      func_var.index());
  }
  return Result::Ok;
}